

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver.cpp
# Opt level: O1

void __thiscall
Laplace2DProblem_iterative_solver_test_Test::~Laplace2DProblem_iterative_solver_test_Test
          (Laplace2DProblem_iterative_solver_test_Test *this)

{
  pointer pdVar1;
  
  (this->super_Laplace2DProblem).super_Test._vptr_Test =
       (_func_int **)&PTR__Laplace2DProblem_0015c998;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&(this->super_Laplace2DProblem).a_dense.
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         );
  pdVar1 = (this->super_Laplace2DProblem).b_vector_0.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_Laplace2DProblem).b_vector_0.
                                 super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->super_Laplace2DProblem).b_vector.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_Laplace2DProblem).b_vector.
                                 super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->super_Laplace2DProblem).x_vector.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_Laplace2DProblem).x_vector.
                                 super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  Disa::Matrix_Sparse::~Matrix_Sparse(&(this->super_Laplace2DProblem).a_sparse_0);
  Disa::Matrix_Sparse::~Matrix_Sparse(&(this->super_Laplace2DProblem).a_sparse);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x110);
  return;
}

Assistant:

TEST_F(Laplace2DProblem, iterative_solver_test) {

  Solver_Config data;
  data.type = Solver_Type::jacobi;
  data.maximum_iterations = 1000;
  data.convergence_tolerance = 1.0e-5;
  Solver solver = build_solver(data);

  std::fill(x_vector.begin(), x_vector.end(), 10.0);
  Convergence_Data result = solver.solve(a_sparse, x_vector, b_vector);
  std::cout << "\nJ:  " << result.iteration << "\t" << result.residual_normalised << "\t" << result.duration.count()
            << "us";
  std::cout << "\n";

  data.type = Solver_Type::gauss_seidel;
  solver = build_solver(data);
  std::fill(x_vector.begin(), x_vector.end(), 10.0);
  result = solver.solve(a_sparse, x_vector, b_vector);
  std::cout << "\nGS:  " << result.iteration << "\t" << result.residual_normalised << "\t" << result.duration.count()
            << "us";
  std::cout << "\n";

  data.type = Solver_Type::successive_over_relaxation;
  data.SOR_relaxation = 1.5;
  solver = build_solver(data);
  std::fill(x_vector.begin(), x_vector.end(), 10.0);
  result = solver.solve(a_sparse, x_vector, b_vector);
  std::cout << "\nSOR: " << result.iteration << "\t" << result.residual_normalised << "\t" << result.duration.count()
            << "us";
  std::cout << "\n";
}